

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# title.c
# Opt level: O2

int title_screen(void)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ALLEGRO_BITMAP *pAVar6;
  ALLEGRO_BITMAP *sprite;
  undefined8 uVar7;
  int64_t iVar8;
  int iVar9;
  int iVar10;
  int y;
  bool bVar11;
  ALLEGRO_COLOR AVar12;
  ALLEGRO_COLOR AVar13;
  
  iVar2 = al_get_display_width(screen);
  iVar3 = al_get_display_height(screen);
  AVar12 = makecol(0xff,0xff,0xff);
  pAVar6 = create_memory_bitmap(iVar2,iVar3);
  al_set_target_bitmap();
  iVar9 = 0;
  al_set_blender(0,1,0);
  iVar4 = iVar3 / 2;
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  iVar10 = iVar3;
  for (y = 0; iVar10 = iVar10 + -1, iVar5 != y; y = y + 1) {
    AVar13 = makecol(0,0,iVar9 / iVar4);
    hline(0,y,iVar2,AVar13);
    AVar13 = makecol(0,0,iVar9 / iVar4);
    hline(0,iVar10,iVar2,AVar13);
    iVar9 = iVar9 + 0xff;
  }
  solid_mode();
  sprite = create_memory_bitmap(0x28,8);
  al_set_target_bitmap();
  al_map_rgba(0,0,0);
  al_clear_to_color();
  pAVar1 = font;
  AVar13 = makecol(0,0,0);
  textout(pAVar1,"SPEED",0,0,AVar13);
  stretch_sprite(pAVar6,sprite,iVar2 / 0x80 + 8,iVar3 / 0x18 + 8,iVar2,iVar3);
  pAVar1 = font;
  AVar13 = makecol(0,0,0x40);
  textout(pAVar1,"SPEED",0,0,AVar13);
  stretch_sprite(pAVar6,sprite,iVar2 / 0x80,iVar3 / 0x18,iVar2,iVar3);
  al_set_target_bitmap(pAVar6);
  al_destroy_bitmap(sprite);
  iVar5 = iVar2 / 2;
  textout_shadow("Simultaneous Projections",iVar5,iVar4 + -0x50,AVar12);
  textout_shadow("Employing an Ensemble of Displays",iVar5,iVar4 + -0x40,AVar12);
  textout_shadow("Or alternatively: Stupid Pointless",iVar5,iVar4 + -0x20,AVar12);
  textout_shadow("Effort at Establishing a Dumb Acronym",iVar5,iVar4 + -0x10,AVar12);
  textout_shadow("By Shawn Hargreaves, 1999",iVar5,iVar4 + 0x10,AVar12);
  textout_shadow("Written for the Allegro",iVar5,iVar4 + 0x30,AVar12);
  textout_shadow("SpeedHack competition",iVar5,iVar4 + 0x40,AVar12);
  uVar7 = al_get_backbuffer(screen);
  al_set_target_bitmap(uVar7);
  pAVar6 = replace_bitmap(pAVar6);
  start_retrace_count();
  iVar3 = iVar3 / 0x10;
  iVar5 = -1;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  for (iVar4 = 0; iVar4 != iVar5 + 1; iVar4 = iVar4 + 1) {
    iVar10 = 0;
    AVar12 = makecol(0,0,0);
    al_clear_to_color(AVar12.r);
    iVar9 = 0x11;
    while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
      al_draw_bitmap_region(0,(float)iVar10,(float)iVar2,(float)iVar4,0,(float)iVar10);
      iVar10 = iVar10 + iVar3;
    }
    al_flip_display();
    do {
      poll_input_wait();
      iVar8 = retrace_count();
    } while (iVar8 < (iVar4 << 10) / iVar2);
  }
  stop_retrace_count();
  while ((((joy_b1 != 0 || (key[0x4b] != 0)) || (key[0x43] != 0)) || (key[0x3b] != 0))) {
    poll_input_wait();
  }
  iVar5 = 0;
  iVar2 = 0;
  iVar4 = 0;
  iVar3 = 0;
  while (((iVar2 == 0 && (iVar4 == 0)) && ((iVar3 == 0 && (iVar5 == 0))))) {
    poll_input_wait();
    al_draw_bitmap(0,0,pAVar6,0);
    al_flip_display();
    iVar5 = joy_b1;
    iVar2 = key[0x4b];
    iVar4 = key[0x43];
    iVar3 = key[0x3b];
  }
  al_destroy_bitmap(pAVar6);
  iVar5 = 0;
  if (key[0x3b] == 0) {
    sfx_ping(2);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int title_screen()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   ALLEGRO_BITMAP *bmp, *b;
   ALLEGRO_COLOR white = makecol(255, 255, 255);
   int i, j, y;

   bmp = create_memory_bitmap(SCREEN_W, SCREEN_H);
   al_set_target_bitmap(bmp);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);

   for (i=0; i<SCREEN_H/2; i++) {
      hline(0, i, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
      hline(0, SCREEN_H-i-1, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
   }

   solid_mode();

   b = create_memory_bitmap(40, 8);
   al_set_target_bitmap(b);
   al_clear_to_color(al_map_rgba(0, 0, 0, 0));

   textout(font, "SPEED", 0, 0, makecol(0, 0, 0));
   stretch_sprite(bmp, b, SCREEN_W/128+8, SCREEN_H/24+8, SCREEN_W, SCREEN_H);

   textout(font, "SPEED", 0, 0, makecol(0, 0, 64));
   stretch_sprite(bmp, b, SCREEN_W/128, SCREEN_H/24, SCREEN_W, SCREEN_H);

   al_set_target_bitmap(bmp);

   al_destroy_bitmap(b);

   textout_shadow("Simultaneous Projections", SCREEN_W/2, SCREEN_H/2-80, white);
   textout_shadow("Employing an Ensemble of Displays", SCREEN_W/2, SCREEN_H/2-64, white);

   textout_shadow("Or alternatively: Stupid Pointless", SCREEN_W/2, SCREEN_H/2-32, white);
   textout_shadow("Effort at Establishing a Dumb Acronym", SCREEN_W/2, SCREEN_H/2-16, white);

   textout_shadow("By Shawn Hargreaves, 1999", SCREEN_W/2, SCREEN_H/2+16, white);
   textout_shadow("Written for the Allegro", SCREEN_W/2, SCREEN_H/2+48, white);
   textout_shadow("SpeedHack competition", SCREEN_W/2, SCREEN_H/2+64, white);

   al_set_target_bitmap(al_get_backbuffer(screen));

   bmp = replace_bitmap(bmp);

   start_retrace_count();

   for (i=0; i<=SCREEN_H/16; i++) {
      al_clear_to_color(makecol(0, 0, 0));

      for (j=0; j<=16; j++) {
	 y = j*(SCREEN_H/16);
	 al_draw_bitmap_region(bmp, 0, y, SCREEN_W, i, 0, y, 0);
      }

      al_flip_display();

      do {
	 poll_input_wait();
      } while (retrace_count() < i*1024/SCREEN_W);
   }

   stop_retrace_count();

   while (joy_b1 || key[ALLEGRO_KEY_SPACE] || key[ALLEGRO_KEY_ENTER] || key[ALLEGRO_KEY_ESCAPE])
      poll_input_wait();

   while (!key[ALLEGRO_KEY_SPACE] && !key[ALLEGRO_KEY_ENTER] && !key[ALLEGRO_KEY_ESCAPE] && !joy_b1) {
      poll_input_wait();
      al_draw_bitmap(bmp, 0, 0, 0);
      al_flip_display();
   }

   al_destroy_bitmap(bmp);

   if (key[ALLEGRO_KEY_ESCAPE])
      return FALSE;

   sfx_ping(2);

   return TRUE;
}